

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterHasNoReset.cpp
# Opt level: O1

string * __thiscall
RegisterHasNoReset::description_abi_cxx11_(string *__return_storage_ptr__,RegisterHasNoReset *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 uVar8;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 local_2c8 [24];
  text_style local_2b0;
  text_style local_29c;
  buffer<char> local_288;
  char local_268 [568];
  
  local_29c.foreground_color.is_rgb = false;
  local_29c.foreground_color.value.term_color = '\0';
  local_29c.background_color.is_rgb = false;
  local_29c.background_color.value.term_color = '\0';
  local_29c.set_foreground_color = false;
  local_29c.set_background_color = false;
  local_29c.ems = italic;
  local_288.size_ = 0;
  local_288.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_288.capacity_ = 500;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = &local_348;
  fmt.size_ = 0x149;
  fmt.data_ = 
  "module m (logic clk, logic reset);\n    logic r;\n    always_ff @(posedge clk or negedge reset) begin\n                               ^^^^^^^^^^^^^------\\\n                                                  \\\n        r <= 1\'b1;                                \\\n        ^~~~Register r do not have a value when reset\n    end\nendmodule\n\n"
  ;
  local_288.ptr_ = local_268;
  ::fmt::v11::detail::vformat_to<char>
            (&local_288,&local_29c,fmt,(basic_format_args<fmt::v11::context>)(auVar3 << 0x40));
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,local_288.ptr_,local_288.ptr_ + local_288.size_);
  if (local_288.ptr_ != local_268) {
    free(local_288.ptr_);
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_2e8,0,0,
                      "A register in an always_ff, which contains the reset signal on its sensitivity list, which\ndo not have a value when the design is on reset. This will cause errors with synthesis\ntools since they will use an incorrect register cell.\n\n"
                      ,0xe9);
  local_308._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p == paVar6) {
    local_308.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_308.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  }
  else {
    local_308.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_308._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_308,"Instead the always_ff should be written like this:\n\n");
  paVar6 = &local_328.field_2;
  local_328._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar7 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p == paVar7) {
    local_328.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_328.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_328._M_dataplus._M_p = (pointer)paVar6;
  }
  else {
    local_328.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  local_328._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_2b0.foreground_color.is_rgb = false;
  local_2b0.foreground_color.value.term_color = '\0';
  local_2b0.background_color.is_rgb = false;
  local_2b0.background_color.value.term_color = '\0';
  local_2b0.set_foreground_color = false;
  local_2b0.set_background_color = false;
  local_2b0.ems = italic;
  local_288.size_ = 0;
  local_288.grow_ =
       ::fmt::v11::basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_288.capacity_ = 500;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_2c8;
  fmt_00.size_ = 0x78;
  fmt_00.data_ = 
  "module m (logic clk, logic reset);\n    logic r;\n    always_ff @(posedge clk) begin\n        r <= 1\'b1;\n    end\nendmodule\n"
  ;
  local_288.ptr_ = local_268;
  ::fmt::v11::detail::vformat_to<char>
            (&local_288,&local_2b0,fmt_00,(basic_format_args<fmt::v11::context>)(auVar4 << 0x40));
  paVar7 = &local_348.field_2;
  local_348._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,local_288.ptr_,local_288.ptr_ + local_288.size_);
  if (local_288.ptr_ != local_268) {
    free(local_288.ptr_);
  }
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar6) {
    uVar8 = local_328.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_348._M_string_length + local_328._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar7) {
      uVar8 = local_348.field_2._M_allocated_capacity;
    }
    if (local_348._M_string_length + local_328._M_string_length <= (ulong)uVar8) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_348,0,0,local_328._M_dataplus._M_p,local_328._M_string_length);
      goto LAB_00197bcb;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_328,local_348._M_dataplus._M_p,local_348._M_string_length);
LAB_00197bcb:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar8 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar7) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != paVar6) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string description() const override {
        return "A register in an always_ff, which contains the reset signal on its sensitivity "
               "list, which\ndo not have a value when the design is on reset. This will cause "
               "errors with "
               "synthesis\ntools since they will use an incorrect register cell.\n\n" +
               fmt::format(fmt::emphasis::italic,
                           "module m (logic clk, logic reset);\n"
                           "    logic r;\n"
                           "    always_ff @(posedge clk or negedge reset) begin\n"
                           "                               ^^^^^^^^^^^^^------\\\n"
                           "                                                  \\\n"
                           "        r <= 1'b1;                                \\\n"
                           "        ^~~~Register r do not have a value when reset\n"
                           "    end\n"
                           "endmodule\n\n") +
               "Instead the always_ff should be written like this:\n\n" +
               fmt::format(fmt::emphasis::italic, "module m (logic clk, logic reset);\n"
                                                  "    logic r;\n"
                                                  "    always_ff @(posedge clk) begin\n"
                                                  "        r <= 1'b1;\n"
                                                  "    end\n"
                                                  "endmodule\n");
    }